

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.hh
# Opt level: O0

GeomPrimvar * __thiscall tinyusdz::GeomPrimvar::operator=(GeomPrimvar *this,GeomPrimvar *rhs)

{
  bool bVar1;
  GeomPrimvar *rhs_local;
  GeomPrimvar *this_local;
  
  ::std::__cxx11::string::operator=((string *)this,(string *)rhs);
  Attribute::operator=(&this->_attr,&rhs->_attr);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->_indices,&rhs->_indices);
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::operator=
            (&this->_ts_indices,&rhs->_ts_indices);
  this->_has_value = (bool)(rhs->_has_value & 1);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->_elementSize);
  if (bVar1) {
    nonstd::optional_lite::optional<unsigned_int>::operator=(&this->_elementSize,&rhs->_elementSize)
    ;
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->_interpolation);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
              (&this->_interpolation,&rhs->_interpolation);
  }
  nonstd::optional_lite::optional<int>::operator=
            (&this->_unauthoredValuesIndex,&rhs->_unauthoredValuesIndex);
  return this;
}

Assistant:

GeomPrimvar &operator=(const GeomPrimvar &rhs) {
    _name = rhs._name;
    _attr = rhs._attr;
    _indices = rhs._indices;
    _ts_indices = rhs._ts_indices;
    _has_value = rhs._has_value;
    if (rhs._elementSize) {
      _elementSize = rhs._elementSize;
    }

    if (rhs._interpolation) {
      _interpolation = rhs._interpolation;
    }
    _unauthoredValuesIndex = rhs._unauthoredValuesIndex;

    return *this;
  }